

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O3

REF_STATUS
ref_phys_yplus_lengthscale
          (REF_GRID ref_grid,REF_DBL mach,REF_DBL re,REF_DBL reference_t_k,REF_INT ldim,
          REF_DBL *field,REF_DBL *lengthscale)

{
  int *piVar1;
  REF_GLOB *pRVar2;
  REF_DBL *pRVar3;
  int iVar4;
  int iVar5;
  REF_STATUS RVar6;
  uint uVar7;
  void *__s;
  long lVar8;
  long lVar9;
  ulong uVar10;
  undefined8 uVar11;
  int iVar12;
  char *pcVar13;
  REF_NODE ref_node;
  int iVar14;
  long lVar15;
  REF_CELL ref_cell;
  double y;
  double u;
  REF_INT ntri;
  REF_DBL tangent [3];
  REF_DBL yplus_dist;
  REF_INT tri_list [2];
  REF_DBL edg_norm [3];
  REF_INT edg_nodes [27];
  REF_INT tri_nodes [27];
  int local_1c4;
  REF_CELL local_1c0;
  double local_1b8;
  double local_1b0;
  double local_1a8;
  REF_GRID local_198;
  void *local_190;
  REF_NODE local_188;
  REF_CELL local_180;
  long local_178;
  long local_170;
  REF_DBL local_168;
  REF_DBL local_160;
  REF_DBL local_158;
  REF_DBL *local_150;
  double local_148;
  REF_INT local_140 [2];
  double local_138;
  double local_130;
  double local_128;
  REF_INT local_118;
  REF_INT local_114;
  int local_a8;
  int local_a4;
  int local_a0;
  
  ref_node = ref_grid->node;
  uVar7 = ref_node->max;
  lVar15 = (long)(int)uVar7;
  if (0 < lVar15) {
    pRVar2 = ref_node->global;
    lVar8 = 0;
    do {
      if (-1 < pRVar2[lVar8]) {
        lengthscale[lVar8] = 0.0;
      }
      lVar8 = lVar8 + 1;
    } while (lVar15 != lVar8);
  }
  local_168 = mach;
  local_160 = re;
  local_158 = reference_t_k;
  local_150 = field;
  if ((int)uVar7 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x2fc,
           "ref_phys_yplus_lengthscale","malloc hits of REF_INT negative");
LAB_001cf101:
    uVar7 = 1;
  }
  else {
    __s = malloc(lVar15 << 2);
    if (__s == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x2fc,
             "ref_phys_yplus_lengthscale","malloc hits of REF_INT NULL");
      uVar7 = 2;
    }
    else {
      if (0 < (int)uVar7) {
        memset(__s,0,lVar15 << 2);
      }
      if (ref_grid->twod == 0) {
        pcVar13 = "implement 3D";
        uVar7 = 6;
        uVar11 = 0x332;
        uVar10 = 6;
      }
      else {
        ref_cell = ref_grid->cell[0];
        local_1c0 = ref_cell;
        if (0 < ref_cell->max) {
          local_180 = ref_grid->cell[3];
          iVar14 = 0;
          local_198 = ref_grid;
          local_190 = __s;
          local_188 = ref_node;
          do {
            RVar6 = ref_cell_nodes(ref_cell,iVar14,&local_118);
            if (RVar6 == 0) {
              uVar7 = ref_layer_interior_seg_normal(ref_grid,iVar14,&local_138);
              if (uVar7 != 0) {
                pcVar13 = "edge norm";
                uVar11 = 0x309;
                goto LAB_001cf0d1;
              }
              uVar7 = ref_cell_list_with2(ref_grid->cell[3],local_118,local_114,2,&local_1c4,
                                          local_140);
              if (uVar7 != 0) {
                pcVar13 = "tri with2";
                uVar11 = 0x30c;
                goto LAB_001cf0d1;
              }
              if ((long)local_1c4 != 1) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                       ,0x30d,"ref_phys_yplus_lengthscale","edg expects one tri",1,(long)local_1c4);
                goto LAB_001cf101;
              }
              uVar7 = ref_cell_nodes(local_180,local_140[0],&local_a8);
              iVar5 = local_a0;
              iVar4 = local_a4;
              iVar12 = local_a8;
              if (uVar7 != 0) {
                pcVar13 = "tri nodes";
                uVar11 = 0x30f;
                goto LAB_001cf0d1;
              }
              lVar15 = (long)local_118;
              local_178 = (long)local_114;
              pRVar3 = ref_node->real;
              local_1b8 = pRVar3[local_178 * 0xf] - pRVar3[lVar15 * 0xf];
              local_1b0 = pRVar3[local_178 * 0xf + 1] - pRVar3[lVar15 * 0xf + 1];
              local_1a8 = pRVar3[local_178 * 0xf + 2] - pRVar3[lVar15 * 0xf + 2];
              local_170 = lVar15;
              uVar7 = ref_math_normalize(&local_1b8);
              ref_node = local_188;
              if (uVar7 != 0) {
                pcVar13 = "normalize tangent";
                uVar11 = 0x319;
                goto LAB_001cf0d1;
              }
              iVar12 = (iVar4 + iVar5 + (iVar12 - (int)local_170)) - (int)local_178;
              lVar8 = (long)(iVar12 * ldim);
              pRVar3 = local_188->real;
              lVar9 = (long)(iVar12 * 0xf);
              u = 0.0 - (local_150[lVar8 + 3] * local_1a8 +
                        local_150[lVar8 + 1] * local_1b8 + local_1b0 * local_150[lVar8 + 2]);
              if (u <= -u) {
                u = -u;
              }
              y = (pRVar3[lVar9 + 2] - pRVar3[lVar15 * 0xf + 2]) * local_128 +
                  (pRVar3[lVar9] - pRVar3[lVar15 * 0xf]) * local_138 +
                  (pRVar3[lVar9 + 1] - pRVar3[lVar15 * 0xf + 1]) * local_130;
              if (y <= -y) {
                y = -y;
              }
              lVar15 = (long)((int)local_170 * ldim);
              uVar7 = ref_phys_yplus_dist(local_168,local_160,local_158,local_150[lVar15],
                                          (local_150[lVar15 + 4] / local_150[lVar15]) * 1.4,y,u,
                                          &local_148);
              if (uVar7 != 0) {
                pcVar13 = "yplus dist";
                uVar11 = 0x32b;
                goto LAB_001cf0d1;
              }
              lVar15 = (long)local_118;
              lengthscale[lVar15] = lengthscale[lVar15] + local_148;
              piVar1 = (int *)((long)local_190 + lVar15 * 4);
              *piVar1 = *piVar1 + 1;
              lVar15 = (long)local_114;
              lengthscale[lVar15] = local_148 + lengthscale[lVar15];
              piVar1 = (int *)((long)local_190 + lVar15 * 4);
              *piVar1 = *piVar1 + 1;
              __s = local_190;
              ref_grid = local_198;
              ref_cell = local_1c0;
            }
            iVar14 = iVar14 + 1;
          } while (iVar14 < ref_cell->max);
          uVar7 = ref_node->max;
        }
        if (0 < (int)uVar7) {
          pRVar2 = ref_node->global;
          uVar10 = 0;
          do {
            if ((-1 < pRVar2[uVar10]) && (iVar14 = *(int *)((long)__s + uVar10 * 4), 0 < iVar14)) {
              lengthscale[uVar10] = lengthscale[uVar10] / (double)iVar14;
            }
            uVar10 = uVar10 + 1;
          } while (uVar7 != uVar10);
        }
        free(__s);
        uVar7 = ref_node_ghost_dbl(ref_node,lengthscale,1);
        if (uVar7 == 0) {
          return 0;
        }
        pcVar13 = "ghost lengthscale";
        uVar11 = 0x33b;
LAB_001cf0d1:
        uVar10 = (ulong)uVar7;
      }
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",uVar11
             ,"ref_phys_yplus_lengthscale",uVar10,pcVar13);
    }
  }
  return uVar7;
}

Assistant:

REF_FCN REF_STATUS ref_phys_yplus_lengthscale(REF_GRID ref_grid, REF_DBL mach,
                                              REF_DBL re, REF_DBL reference_t_k,
                                              REF_INT ldim, REF_DBL *field,
                                              REF_DBL *lengthscale) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT *hits;
  REF_INT node;
  each_ref_node_valid_node(ref_node, node) { lengthscale[node] = 0.0; }
  ref_malloc_init(hits, ref_node_max(ref_node), REF_INT, 0);
  if (ref_grid_twod(ref_grid)) {
    REF_CELL edg_cell = ref_grid_edg(ref_grid);
    REF_CELL tri_cell = ref_grid_tri(ref_grid);
    REF_INT edg, tri;
    REF_INT edg_nodes[REF_CELL_MAX_SIZE_PER];
    REF_INT tri_nodes[REF_CELL_MAX_SIZE_PER];
    REF_INT ntri, tri_list[2];
    REF_INT off_node, on_node;
    REF_DBL dn, du, u0, u1, dxyz[3], edg_norm[3], tangent[3];
    REF_DBL rho, t, yplus_dist;
    REF_DBL gamma = 1.4, press;
    each_ref_cell_valid_cell_with_nodes(edg_cell, edg, edg_nodes) {
      RSS(ref_layer_interior_seg_normal(ref_grid, edg, edg_norm), "edge norm");
      RSS(ref_cell_list_with2(ref_grid_tri(ref_grid), edg_nodes[0],
                              edg_nodes[1], 2, &ntri, tri_list),
          "tri with2");
      REIS(1, ntri, "edg expects one tri");
      tri = tri_list[0];
      RSS(ref_cell_nodes(tri_cell, tri, tri_nodes), "tri nodes");
      on_node = edg_nodes[0];
      off_node = tri_nodes[0] + tri_nodes[1] + tri_nodes[2] - edg_nodes[0] -
                 edg_nodes[1];
      tangent[0] = ref_node_xyz(ref_node, 0, edg_nodes[1]) -
                   ref_node_xyz(ref_node, 0, edg_nodes[0]);
      tangent[1] = ref_node_xyz(ref_node, 1, edg_nodes[1]) -
                   ref_node_xyz(ref_node, 1, edg_nodes[0]);
      tangent[2] = ref_node_xyz(ref_node, 2, edg_nodes[1]) -
                   ref_node_xyz(ref_node, 2, edg_nodes[0]);
      RSS(ref_math_normalize(tangent), "normalize tangent");

      u0 = ref_math_dot(&(field[1 + ldim * on_node]), tangent);
      u1 = ref_math_dot(&(field[1 + ldim * off_node]), tangent);
      u0 = 0.0; /* assume no-slip bc */
      dxyz[0] = ref_node_xyz(ref_node, 0, off_node) -
                ref_node_xyz(ref_node, 0, on_node);
      dxyz[1] = ref_node_xyz(ref_node, 1, off_node) -
                ref_node_xyz(ref_node, 1, on_node);
      dxyz[2] = ref_node_xyz(ref_node, 2, off_node) -
                ref_node_xyz(ref_node, 2, on_node);
      du = ABS(u0 - u1);
      dn = ABS(ref_math_dot(dxyz, edg_norm));
      rho = field[0 + ldim * on_node];
      press = field[4 + ldim * on_node];
      t = gamma * (press / rho);
      RSS(ref_phys_yplus_dist(mach, re, reference_t_k, rho, t, dn, du,
                              &yplus_dist),
          "yplus dist");
      lengthscale[edg_nodes[0]] += yplus_dist;
      hits[edg_nodes[0]] += 1;
      lengthscale[edg_nodes[1]] += yplus_dist;
      hits[edg_nodes[1]] += 1;
    }
  } else {
    RSS(REF_IMPLEMENT, "implement 3D");
  }
  each_ref_node_valid_node(ref_node, node) {
    if (hits[node] > 0) {
      lengthscale[node] /= (REF_DBL)hits[node];
    }
  }
  ref_free(hits);

  RSS(ref_node_ghost_dbl(ref_node, lengthscale, 1), "ghost lengthscale");

  return REF_SUCCESS;
}